

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.h
# Opt level: O2

void __thiscall BindingEnv::BindingEnv(BindingEnv *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_Env)._vptr_Env = (_func_int **)&PTR__BindingEnv_0012ccf0;
  p_Var1 = &(this->bindings_)._M_t._M_impl.super__Rb_tree_header;
  (this->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->bindings_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->rules_)._M_t._M_impl.super__Rb_tree_header;
  (this->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->rules_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->parent_ = (BindingEnv *)0x0;
  return;
}

Assistant:

BindingEnv() : parent_(NULL) {}